

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O1

bool wasm::tooCostlyToRunUnconditionally(PassOptions *passOptions,Expression *one,Expression *two)

{
  uint uVar1;
  undefined8 in_RAX;
  bool bVar2;
  uint local_28;
  undefined4 local_24;
  
  local_24 = (undefined4)((ulong)in_RAX >> 0x20);
  if (passOptions->shrinkLevel < 2) {
    uVar1 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                      ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)&local_28,one);
    _local_28 = CONCAT44(local_24,uVar1);
    uVar1 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                      ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)&local_24,two);
    if (uVar1 < local_28) {
      uVar1 = local_28;
    }
    if (passOptions->shrinkLevel == 1) {
      bVar2 = uVar1 < 8;
    }
    else {
      if (passOptions->shrinkLevel != 0) {
        handle_unreachable("bad shrink level",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                           ,0x73);
      }
      bVar2 = uVar1 < 5;
    }
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool tooCostlyToRunUnconditionally(const PassOptions& passOptions,
                                          Expression* one,
                                          Expression* two) {
  // If we care entirely about code size, just do it for that reason (early
  // exit to avoid work).
  if (passOptions.shrinkLevel >= 2) {
    return false;
  }

  // Consider the cost of executing all the code unconditionally, which adds
  // either the cost of running one or two, so the maximum is the worst case.
  auto max = std::max(CostAnalyzer(one).cost, CostAnalyzer(two).cost);
  return tooCostlyToRunUnconditionally(passOptions, max);
}